

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_comp.cpp
# Opt level: O2

bool __thiscall
crnlib::crn_comp::pack_color_endpoints_etc
          (crn_comp *this,vector<unsigned_char> *packed_data,vector<unsigned_short> *remapping)

{
  uint uVar1;
  uint *puVar2;
  unsigned_short *puVar3;
  uchar *puVar4;
  undefined8 uVar5;
  uint32 p;
  ulong uVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  uint32 _e_1;
  uint32 p_1;
  bool bVar10;
  vector<unsigned_int> remapped_endpoints;
  symbol_histogram hist;
  static_huffman_data_model dm;
  symbol_codec local_c8;
  
  vector<unsigned_int>::vector(&remapped_endpoints,(this->m_color_endpoints).m_size);
  puVar2 = (this->m_color_endpoints).m_p;
  puVar3 = remapping->m_p;
  for (uVar6 = 0; uVar6 < (this->m_color_endpoints).m_size; uVar6 = uVar6 + 1) {
    uVar7 = puVar2[uVar6];
    remapped_endpoints.m_p[puVar3[uVar6]] = uVar7 >> 3 & 0x1f1f1f | uVar7 & 0x7000000;
  }
  vector<unsigned_int>::vector(&hist.m_hist,0x20);
  uVar7 = 0;
  for (uVar6 = 0; uVar6 < remapped_endpoints.m_size; uVar6 = uVar6 + 1) {
    uVar1 = remapped_endpoints.m_p[uVar6];
    iVar8 = 4;
    uVar9 = uVar1;
    while (bVar10 = iVar8 != 0, iVar8 = iVar8 + -1, bVar10) {
      hist.m_hist.m_p[uVar9 - uVar7 & 0x1f] = hist.m_hist.m_p[uVar9 - uVar7 & 0x1f] + 1;
      uVar7 = uVar7 >> 8;
      uVar9 = uVar9 >> 8;
    }
    uVar7 = uVar1;
  }
  static_huffman_data_model::static_huffman_data_model(&dm);
  static_huffman_data_model::init(&dm,(EVP_PKEY_CTX *)0x1);
  symbol_codec::symbol_codec(&local_c8);
  symbol_codec::start_encoding(&local_c8,0x100000);
  symbol_codec::encode_transmit_static_huffman_data_model
            (&local_c8,&dm,false,(static_huffman_data_model *)0x0);
  uVar7 = 0;
  for (uVar6 = 0; uVar6 < remapped_endpoints.m_size; uVar6 = uVar6 + 1) {
    uVar1 = remapped_endpoints.m_p[uVar6];
    iVar8 = 4;
    uVar9 = uVar1;
    while (bVar10 = iVar8 != 0, iVar8 = iVar8 + -1, bVar10) {
      symbol_codec::encode(&local_c8,uVar9 - uVar7 & 0x1f,&dm);
      uVar7 = uVar7 >> 8;
      uVar9 = uVar9 >> 8;
    }
    uVar7 = uVar1;
  }
  symbol_codec::stop_encoding(&local_c8,false);
  puVar4 = packed_data->m_p;
  packed_data->m_p = local_c8.m_output_buf.m_p;
  uVar5._0_4_ = packed_data->m_size;
  uVar5._4_4_ = packed_data->m_capacity;
  packed_data->m_size = local_c8.m_output_buf.m_size;
  packed_data->m_capacity = local_c8.m_output_buf.m_capacity;
  local_c8.m_output_buf.m_p = puVar4;
  local_c8.m_output_buf._8_8_ = uVar5;
  symbol_codec::~symbol_codec(&local_c8);
  static_huffman_data_model::~static_huffman_data_model(&dm);
  vector<unsigned_int>::~vector(&hist.m_hist);
  vector<unsigned_int>::~vector(&remapped_endpoints);
  return true;
}

Assistant:

bool crn_comp::pack_color_endpoints_etc(crnlib::vector<uint8>& packed_data, const crnlib::vector<uint16>& remapping)
    {
        crnlib::vector<uint32> remapped_endpoints(m_color_endpoints.size());
        for (uint i = 0; i < m_color_endpoints.size(); i++)
        {
            remapped_endpoints[remapping[i]] = (m_color_endpoints[i] & 0x07000000) | (m_color_endpoints[i] >> 3 & 0x001F1F1F);
        }

        symbol_histogram hist(32);
        for (uint32 prev_endpoint = 0, p = 0; p < remapped_endpoints.size(); p++)
        {
            for (uint32 _e = prev_endpoint, e = prev_endpoint = remapped_endpoints[p], c = 0; c < 4; c++, _e >>= 8, e >>= 8)
            {
                hist.inc_freq((e - _e) & 0x1F);
            }
        }
        static_huffman_data_model dm;
        dm.init(true, hist, 15);
        symbol_codec codec;
        codec.start_encoding(1024 * 1024);
        codec.encode_transmit_static_huffman_data_model(dm, false);
        for (uint32 prev_endpoint = 0, p = 0; p < remapped_endpoints.size(); p++)
        {
            for (uint32 _e = prev_endpoint, e = prev_endpoint = remapped_endpoints[p], c = 0; c < 4; c++, _e >>= 8, e >>= 8)
            {
                codec.encode((e - _e) & 0x1F, dm);
            }
        }
        codec.stop_encoding(false);
        packed_data.swap(codec.get_encoding_buf());
        return true;
    }